

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

unsigned_long xmlChildElementCount(xmlNodePtr parent)

{
  _xmlNode *p_Var1;
  unsigned_long uVar2;
  _xmlNode **pp_Var3;
  
  if (parent == (xmlNodePtr)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    if ((parent->type < XML_DTD_NODE) &&
       ((0x2a42U >> (parent->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      uVar2 = 0;
      pp_Var3 = &parent->children;
      while (p_Var1 = *pp_Var3, p_Var1 != (_xmlNode *)0x0) {
        uVar2 = uVar2 + (p_Var1->type == XML_ELEMENT_NODE);
        pp_Var3 = &p_Var1->next;
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned long
xmlChildElementCount(xmlNodePtr parent) {
    unsigned long ret = 0;
    xmlNodePtr cur = NULL;

    if (parent == NULL)
        return(0);
    switch (parent->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_HTML_DOCUMENT_NODE:
            cur = parent->children;
            break;
        default:
            return(0);
    }
    while (cur != NULL) {
        if (cur->type == XML_ELEMENT_NODE)
            ret++;
        cur = cur->next;
    }
    return(ret);
}